

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O2

int __thiscall ncnn::Dequantize::load_model(Dequantize *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *local_70;
  int *local_68;
  size_t local_60;
  int local_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  size_t local_30;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->scale_data_size,1);
  if (&this->scale_data != (Mat *)&local_70) {
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + 1;
      UNLOCK();
    }
    piVar1 = (this->scale_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->scale_data).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->scale_data).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->scale_data).data = local_70;
    (this->scale_data).refcount = local_68;
    (this->scale_data).elemsize = local_60;
    (this->scale_data).elempack = local_58;
    (this->scale_data).allocator = local_50;
    (this->scale_data).dims = local_48;
    (this->scale_data).w = iStack_44;
    (this->scale_data).h = iStack_40;
    (this->scale_data).d = iStack_3c;
    (this->scale_data).c = local_38;
    (this->scale_data).cstep = local_30;
  }
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      if (local_50 == (Allocator *)0x0) {
        free(local_70);
      }
      else {
        (*local_50->_vptr_Allocator[3])();
      }
    }
  }
  iVar3 = -100;
  if (((this->scale_data).data != (void *)0x0) &&
     ((long)(this->scale_data).c * (this->scale_data).cstep != 0)) {
    if (this->bias_data_size != 0) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->bias_data_size,1);
      if (&this->bias_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->bias_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->bias_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->bias_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->bias_data).data = local_70;
        (this->bias_data).refcount = local_68;
        (this->bias_data).elemsize = local_60;
        (this->bias_data).elempack = local_58;
        (this->bias_data).allocator = local_50;
        (this->bias_data).dims = local_48;
        (this->bias_data).w = iStack_44;
        (this->bias_data).h = iStack_40;
        (this->bias_data).d = iStack_3c;
        (this->bias_data).c = local_38;
        (this->bias_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            free(local_70);
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Dequantize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    if (bias_data_size)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}